

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O0

UnicodeString *
icu_63::TimeZone::getWindowsID(UnicodeString *id,UnicodeString *winid,UErrorCode *status)

{
  UBool UVar1;
  int8_t iVar2;
  UResType UVar3;
  char *src;
  UnicodeString local_110;
  ConstChar16Ptr local_d0;
  UChar *local_c8;
  UChar *end;
  UChar *pUStack_b8;
  UBool hasNext;
  UChar *start;
  UChar *tzids;
  UResourceBundle *pUStack_a0;
  int32_t len;
  UResourceBundle *regionalData;
  UResourceBundle *pUStack_90;
  UBool found;
  UResourceBundle *winzone;
  UResourceBundle *mapTimezones;
  UBool local_69;
  undefined1 local_68 [7];
  UBool isSystemID;
  UnicodeString canonicalID;
  UErrorCode *status_local;
  UnicodeString *winid_local;
  UnicodeString *id_local;
  
  canonicalID.fUnion._48_8_ = status;
  UnicodeString::remove(winid,(char *)winid);
  UVar1 = ::U_FAILURE(*(UErrorCode *)canonicalID.fUnion._48_8_);
  if (UVar1 == '\0') {
    UnicodeString::UnicodeString((UnicodeString *)local_68);
    local_69 = '\0';
    getCanonicalID(id,(UnicodeString *)local_68,&local_69,(UErrorCode *)canonicalID.fUnion._48_8_);
    UVar1 = ::U_FAILURE(*(UErrorCode *)canonicalID.fUnion._48_8_);
    if ((UVar1 == '\0') && (local_69 != '\0')) {
      winzone = ures_openDirect_63((char *)0x0,"windowsZones",
                                   (UErrorCode *)canonicalID.fUnion._48_8_);
      ures_getByKey_63(winzone,"mapTimezones",winzone,(UErrorCode *)canonicalID.fUnion._48_8_);
      UVar1 = ::U_FAILURE(*(UErrorCode *)canonicalID.fUnion._48_8_);
      if (UVar1 == '\0') {
        pUStack_90 = (UResourceBundle *)0x0;
        regionalData._7_1_ = '\0';
        while (UVar1 = ures_hasNext_63(winzone), UVar1 != '\0' && regionalData._7_1_ == '\0') {
          pUStack_90 = ures_getNextResource_63
                                 (winzone,pUStack_90,(UErrorCode *)canonicalID.fUnion._48_8_);
          UVar1 = ::U_FAILURE(*(UErrorCode *)canonicalID.fUnion._48_8_);
          if (UVar1 != '\0') break;
          UVar3 = ures_getType_63(pUStack_90);
          if (UVar3 == RES_TABLE) {
            pUStack_a0 = (UResourceBundle *)0x0;
LAB_002277dc:
            UVar1 = ures_hasNext_63(pUStack_90);
            if (UVar1 != '\0' && regionalData._7_1_ == '\0') {
              pUStack_a0 = ures_getNextResource_63
                                     (pUStack_90,pUStack_a0,(UErrorCode *)canonicalID.fUnion._48_8_)
              ;
              UVar1 = ::U_FAILURE(*(UErrorCode *)canonicalID.fUnion._48_8_);
              if (UVar1 != '\0') goto LAB_00227a53;
              UVar3 = ures_getType_63(pUStack_a0);
              if (UVar3 == RES_STRING) {
                start = ures_getString_63(pUStack_a0,(int32_t *)((long)&tzids + 4),
                                          (UErrorCode *)canonicalID.fUnion._48_8_);
                UVar1 = ::U_FAILURE(*(UErrorCode *)canonicalID.fUnion._48_8_);
                if (UVar1 != '\0') goto LAB_00227a53;
                pUStack_b8 = start;
                end._7_1_ = '\x01';
                while (end._7_1_ != '\0') {
                  local_c8 = u_strchr_63(pUStack_b8,L' ');
                  if (local_c8 == (UChar *)0x0) {
                    local_c8 = start + tzids._4_4_;
                    end._7_1_ = '\0';
                  }
                  ConstChar16Ptr::ConstChar16Ptr(&local_d0,pUStack_b8);
                  iVar2 = UnicodeString::compare
                                    ((UnicodeString *)local_68,&local_d0,
                                     (int32_t)((ulong)((long)local_c8 - (long)pUStack_b8) >> 1));
                  ConstChar16Ptr::~ConstChar16Ptr(&local_d0);
                  if (iVar2 == '\0') {
                    src = ures_getKey_63(pUStack_90);
                    UnicodeString::UnicodeString(&local_110,src,-1,kInvariant);
                    UnicodeString::operator=(winid,&local_110);
                    UnicodeString::~UnicodeString(&local_110);
                    regionalData._7_1_ = '\x01';
                    break;
                  }
                  pUStack_b8 = local_c8 + 1;
                }
              }
              goto LAB_002277dc;
            }
LAB_00227a53:
            ures_close_63(pUStack_a0);
          }
        }
        ures_close_63(pUStack_90);
        ures_close_63(winzone);
      }
    }
    else if (*(int *)canonicalID.fUnion._48_8_ == 1) {
      *(undefined4 *)canonicalID.fUnion._48_8_ = 0;
    }
    mapTimezones._0_4_ = 1;
    UnicodeString::~UnicodeString((UnicodeString *)local_68);
  }
  return winid;
}

Assistant:

UnicodeString&
TimeZone::getWindowsID(const UnicodeString& id, UnicodeString& winid, UErrorCode& status) {
    winid.remove();
    if (U_FAILURE(status)) {
        return winid;
    }

    // canonicalize the input ID
    UnicodeString canonicalID;
    UBool isSystemID = FALSE;

    getCanonicalID(id, canonicalID, isSystemID, status);
    if (U_FAILURE(status) || !isSystemID) {
        // mapping data is only applicable to tz database IDs
        if (status == U_ILLEGAL_ARGUMENT_ERROR) {
            // getWindowsID() sets an empty string where
            // getCanonicalID() sets a U_ILLEGAL_ARGUMENT_ERROR.
            status = U_ZERO_ERROR;
        }
        return winid;
    }

    UResourceBundle *mapTimezones = ures_openDirect(NULL, "windowsZones", &status);
    ures_getByKey(mapTimezones, "mapTimezones", mapTimezones, &status);

    if (U_FAILURE(status)) {
        return winid;
    }

    UResourceBundle *winzone = NULL;
    UBool found = FALSE;
    while (ures_hasNext(mapTimezones) && !found) {
        winzone = ures_getNextResource(mapTimezones, winzone, &status);
        if (U_FAILURE(status)) {
            break;
        }
        if (ures_getType(winzone) != URES_TABLE) {
            continue;
        }
        UResourceBundle *regionalData = NULL;
        while (ures_hasNext(winzone) && !found) {
            regionalData = ures_getNextResource(winzone, regionalData, &status);
            if (U_FAILURE(status)) {
                break;
            }
            if (ures_getType(regionalData) != URES_STRING) {
                continue;
            }
            int32_t len;
            const UChar *tzids = ures_getString(regionalData, &len, &status);
            if (U_FAILURE(status)) {
                break;
            }

            const UChar *start = tzids;
            UBool hasNext = TRUE;
            while (hasNext) {
                const UChar *end = u_strchr(start, (UChar)0x20);
                if (end == NULL) {
                    end = tzids + len;
                    hasNext = FALSE;
                }
                if (canonicalID.compare(start, static_cast<int32_t>(end - start)) == 0) {
                    winid = UnicodeString(ures_getKey(winzone), -1 , US_INV);
                    found = TRUE;
                    break;
                }
                start = end + 1;
            }
        }
        ures_close(regionalData);
    }
    ures_close(winzone);
    ures_close(mapTimezones);

    return winid;
}